

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze_live_input_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::AnalyzeLiveInputPass::Process(AnalyzeLiveInputPass *this)

{
  IRContext *this_00;
  bool bVar1;
  Status SVar2;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
  }
  bVar1 = EnumSet<spv::Capability>::contains
                    (&((this_00->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->capabilities_,Shader);
  if (bVar1) {
    SVar2 = DoLiveInputAnalysis(this);
    return SVar2;
  }
  return SuccessWithoutChange;
}

Assistant:

Pass::Status AnalyzeLiveInputPass::Process() {
  // Current functionality assumes shader capability
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return Status::SuccessWithoutChange;
  Pass::Status status = DoLiveInputAnalysis();
  return status;
}